

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

bool __thiscall EOPlus::Context::QueryRule(Context *this,string *rule)

{
  bool bVar1;
  anon_class_1_0_00000001 local_59;
  function<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&)> local_58;
  string local_38;
  string *local_18;
  string *rule_local;
  Context *this_local;
  
  local_18 = rule;
  rule_local = (string *)this;
  std::__cxx11::string::string((string *)&local_38,(string *)rule);
  std::function<bool(std::deque<util::variant,std::allocator<util::variant>>const&)>::
  function<EOPlus::Context::QueryRule(std::__cxx11::string)const::__0,void>
            ((function<bool(std::deque<util::variant,std::allocator<util::variant>>const&)> *)
             &local_58,&local_59);
  bVar1 = QueryRule(this,&local_38,&local_58);
  std::function<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&)>::~function
            (&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

bool Context::QueryRule(std::string rule) const
	{
		return this->QueryRule(rule, [](const std::deque<util::variant>&) { return true; });
	}